

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.h
# Opt level: O3

int __thiscall
TPZSFMatrix<long_double>::PutVal
          (TPZSFMatrix<long_double> *this,int64_t row,int64_t col,longdouble *value)

{
  int64_t iVar1;
  int64_t loccol;
  int64_t locrow;
  
  iVar1 = col;
  if (col < row) {
    iVar1 = row;
  }
  if (row < col) {
    col = row;
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  *(longdouble *)((long)this->fElem + col * 0x10 + ((iVar1 + 1) * iVar1 & 0xfffffffffffffffeU) * 8)
       = *value;
  return 1;
}

Assistant:

inline int
TPZSFMatrix<TVar> ::PutVal(const int64_t row,const int64_t col,const TVar &value )
{
	int64_t locrow = row, loccol = col;
	if ( locrow < loccol )
		this->Swap( &locrow, &loccol );
	
	this->fDecomposed = 0;
	this->fElem[ ((locrow*(locrow+1)) >> 1) + loccol ] = value;
	return( 1 );
}